

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenTypeGet_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type)

{
  bool bVar1;
  Type local_40;
  Type *local_20;
  Type *type_local;
  CSharpGenerator *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (CSharpGenerator *)__return_storage_ptr__;
  bVar1 = IsScalar(type->base_type);
  if (bVar1) {
    GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,local_20);
  }
  else {
    bVar1 = IsArray(local_20);
    if (bVar1) {
      Type::VectorType(&local_40,local_20);
      GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,&local_40);
    }
    else {
      GenTypePointer_abi_cxx11_(__return_storage_ptr__,this,local_20);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeGet(const Type &type) const {
    return IsScalar(type.base_type)
               ? GenTypeBasic(type)
               : (IsArray(type) ? GenTypeGet(type.VectorType())
                                : GenTypePointer(type));
  }